

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

void __thiscall iutest::detail::IParamTestSuiteInfo::RegisterTests(IParamTestSuiteInfo *this)

{
  bool bVar1;
  reference ppIVar2;
  __normal_iterator<iutest::detail::IParamTestInfoData_*const_*,_std::vector<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>_>
  local_20;
  const_iterator end;
  const_iterator it;
  IParamTestSuiteInfo *this_local;
  
  end = std::
        vector<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
        ::begin((vector<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
                 *)(this + 8));
  local_20._M_current =
       (IParamTestInfoData **)
       std::
       vector<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
       ::end((vector<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
              *)(this + 8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_20);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<iutest::detail::IParamTestInfoData_*const_*,_std::vector<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>_>
              ::operator*(&end);
    (**(code **)(*(long *)this + 0x10))(this,*ppIVar2);
    __gnu_cxx::
    __normal_iterator<iutest::detail::IParamTestInfoData_*const_*,_std::vector<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

void RegisterTests() const
    {
        for( TestInfoContainer::const_iterator it=m_testinfos.begin(), end=m_testinfos.end(); it != end; ++it )
        {
            OnRegisterTests(*it);
        }
    }